

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-make.c
# Opt level: O0

void object_prep(object *obj,object_kind *k,wchar_t lev,aspect rand_aspect)

{
  _Bool _Var1;
  int iVar2;
  int local_24;
  wchar_t i;
  aspect rand_aspect_local;
  wchar_t lev_local;
  object_kind *k_local;
  object *obj_local;
  
  memset(obj,0,0x148);
  obj->kind = k;
  obj->tval = (uint8_t)k->tval;
  obj->sval = (uint8_t)k->sval;
  obj->ac = (int16_t)k->ac;
  obj->dd = (uint8_t)k->dd;
  obj->ds = (uint8_t)k->ds;
  obj->weight = (int16_t)k->weight;
  obj->effect = k->effect;
  obj->activation = k->activation;
  iVar2 = (k->time).dice;
  (obj->time).base = (k->time).base;
  (obj->time).dice = iVar2;
  iVar2 = (k->time).m_bonus;
  (obj->time).sides = (k->time).sides;
  (obj->time).m_bonus = iVar2;
  obj->number = '\x01';
  flag_copy(obj->flags,k->base->flags,6);
  flag_copy(obj->flags,k->flags,6);
  for (local_24 = 0; local_24 < 0x11; local_24 = local_24 + 1) {
    iVar2 = randcalc(k->modifiers[local_24],lev,rand_aspect);
    obj->modifiers[local_24] = (int16_t)iVar2;
  }
  _Var1 = tval_can_have_charges(obj);
  if (_Var1) {
    iVar2 = randcalc(k->charge,lev,rand_aspect);
    obj->pval = (int16_t)iVar2;
  }
  _Var1 = tval_is_edible(obj);
  if ((((_Var1) || (_Var1 = tval_is_potion(obj), _Var1)) || (_Var1 = tval_is_fuel(obj), _Var1)) ||
     (_Var1 = tval_is_launcher(obj), _Var1)) {
    iVar2 = randcalc(k->pval,lev,rand_aspect);
    obj->pval = (int16_t)iVar2;
  }
  _Var1 = tval_is_light(obj);
  if (_Var1) {
    _Var1 = flag_has_dbg(obj->flags,6,0x17,"obj->flags","OF_BURNS_OUT");
    if (_Var1) {
      obj->timeout = z_info->fuel_torch;
    }
    else {
      _Var1 = flag_has_dbg(obj->flags,6,0x18,"obj->flags","OF_TAKES_FUEL");
      if (_Var1) {
        obj->timeout = z_info->default_lamp;
      }
    }
  }
  iVar2 = randcalc(k->to_h,lev,rand_aspect);
  obj->to_h = (int16_t)iVar2;
  iVar2 = randcalc(k->to_d,lev,rand_aspect);
  obj->to_d = (int16_t)iVar2;
  iVar2 = randcalc(k->to_a,lev,rand_aspect);
  obj->to_a = (int16_t)iVar2;
  copy_slays(&obj->slays,k->slays);
  copy_brands(&obj->brands,k->brands);
  copy_curses(obj,k->curses);
  for (local_24 = 0; local_24 < 0x1c; local_24 = local_24 + 1) {
    obj->el_info[local_24].res_level = k->el_info[local_24].res_level;
    obj->el_info[local_24].flags = k->el_info[local_24].flags;
    obj->el_info[local_24].flags = obj->el_info[local_24].flags | k->base->el_info[local_24].flags;
  }
  return;
}

Assistant:

void object_prep(struct object *obj, struct object_kind *k, int lev,
				 aspect rand_aspect)
{
	int i;

	/* Clean slate */
	memset(obj, 0, sizeof(*obj));

	/* Assign the kind and copy across data */
	obj->kind = k;
	obj->tval = k->tval;
	obj->sval = k->sval;
	obj->ac = k->ac;
	obj->dd = k->dd;
	obj->ds = k->ds;
	obj->weight = k->weight;
	obj->effect = k->effect;
	obj->activation = k->activation;
	obj->time = k->time;

	/* Default number */
	obj->number = 1;

	/* Copy flags */
	of_copy(obj->flags, k->base->flags);
	of_copy(obj->flags, k->flags);

	/* Assign modifiers */
	for (i = 0; i < OBJ_MOD_MAX; i++)
		obj->modifiers[i] = randcalc(k->modifiers[i], lev, rand_aspect);

	/* Assign charges (wands/staves only) */
	if (tval_can_have_charges(obj))
		obj->pval = randcalc(k->charge, lev, rand_aspect);

	/* Assign pval for food, oil and launchers */
	if (tval_is_edible(obj) || tval_is_potion(obj) || tval_is_fuel(obj) ||
		tval_is_launcher(obj))
		obj->pval
			= randcalc(k->pval, lev, rand_aspect);

	/* Default fuel */
	if (tval_is_light(obj)) {
		if (of_has(obj->flags, OF_BURNS_OUT))
			obj->timeout = z_info->fuel_torch;
		else if (of_has(obj->flags, OF_TAKES_FUEL))
			obj->timeout = z_info->default_lamp;
	}

	/* Default magic */
	obj->to_h = randcalc(k->to_h, lev, rand_aspect);
	obj->to_d = randcalc(k->to_d, lev, rand_aspect);
	obj->to_a = randcalc(k->to_a, lev, rand_aspect);

	/* Default slays, brands and curses */
	copy_slays(&obj->slays, k->slays);
	copy_brands(&obj->brands, k->brands);
	copy_curses(obj, k->curses);

	/* Default resists */
	for (i = 0; i < ELEM_MAX; i++) {
		obj->el_info[i].res_level = k->el_info[i].res_level;
		obj->el_info[i].flags = k->el_info[i].flags;
		obj->el_info[i].flags |= k->base->el_info[i].flags;
	}
}